

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O1

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  byte bVar1;
  byte bVar2;
  uint j;
  long lVar3;
  size_t sVar4;
  size_t N_00;
  ulong uVar5;
  ulong uVar6;
  size_t N_01;
  uint j_1;
  uchar **ppuVar7;
  ulong uVar8;
  ulong uVar9;
  uchar **t;
  size_t N_02;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  vector_block<unsigned_char_*,_1024U> local_c8;
  vector_block<unsigned_char_*,_1024U> local_a0;
  vector_block<unsigned_char_*,_1024U> local_78;
  byte abStack_50 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)&local_c8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar3) = 0;
    *(undefined8 *)((long)&local_c8._insertpos + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_c8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start + lVar3) = 0;
    *(undefined8 *)
     ((long)&local_c8._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar3) = 0;
    *(undefined4 *)((long)&local_c8._left_in_block + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x78);
  bVar2 = pseudo_median<unsigned_char>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    ppuVar7 = strings;
    do {
      lVar3 = 0;
      do {
        if (ppuVar7[lVar3] == (uchar *)0x0) goto LAB_001adc0b;
        abStack_50[lVar3] = ppuVar7[lVar3][depth];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x20);
      lVar3 = 0;
      t = ppuVar7;
      do {
        vector_block<unsigned_char_*,_1024U>::push_back
                  (&local_c8 +
                   (ulong)(abStack_50[lVar3] == bVar2) + (ulong)(bVar2 < abStack_50[lVar3]) * 2,t);
        lVar3 = lVar3 + 1;
        t = t + 1;
      } while (lVar3 != 0x20);
      uVar8 = uVar8 + 0x20;
      ppuVar7 = ppuVar7 + 0x20;
    } while (uVar8 < (N & 0xffffffffffffffe0));
  }
  lVar3 = N - uVar8;
  if (uVar8 <= N && lVar3 != 0) {
    ppuVar7 = strings + uVar8;
    do {
      if (*ppuVar7 == (uchar *)0x0) {
LAB_001adc0b:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar1 = (*ppuVar7)[depth];
      vector_block<unsigned_char_*,_1024U>::push_back
                (&local_c8 + (ulong)(bVar1 == bVar2) + (ulong)(bVar2 < bVar1) * 2,ppuVar7);
      ppuVar7 = ppuVar7 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  uVar8 = (long)local_c8._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c8._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_00 = uVar8 * 0x80 - (ulong)local_c8._left_in_block;
  uVar5 = (long)local_a0._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a0._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_02 = uVar5 * 0x80 - (ulong)local_a0._left_in_block;
  uVar6 = (long)local_78._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start;
  N_01 = uVar6 * 0x80 - (ulong)local_78._left_in_block;
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned char]"
                 );
  }
  if (uVar8 * 0x80 != (ulong)local_c8._left_in_block) {
    if (local_c8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_c8._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001adc2a;
    ppuVar7 = strings;
    if (8 < uVar8) {
      uVar9 = 2;
      if (2 < (ulong)((long)uVar8 >> 3)) {
        uVar9 = (long)uVar8 >> 3;
      }
      lVar3 = 0;
      do {
        memmove(ppuVar7,local_c8._index_block.
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3],0x2000);
        ppuVar7 = ppuVar7 + 0x400;
        lVar3 = lVar3 + 1;
      } while (uVar9 - 1 != lVar3);
    }
    sVar4 = (long)local_c8._insertpos -
            (long)local_c8._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar4 != 0) {
      memmove(ppuVar7,local_c8._index_block.
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1],sVar4);
    }
  }
  if (uVar5 * 0x80 != (ulong)local_a0._left_in_block) {
    if (local_a0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_a0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001adc2a;
    ppuVar7 = strings + N_00;
    if (8 < uVar5) {
      uVar8 = 2;
      if (2 < (ulong)((long)uVar5 >> 3)) {
        uVar8 = (long)uVar5 >> 3;
      }
      lVar3 = 0;
      do {
        memmove(ppuVar7,local_a0._index_block.
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3],0x2000);
        ppuVar7 = ppuVar7 + 0x400;
        lVar3 = lVar3 + 1;
      } while (uVar8 - 1 != lVar3);
    }
    sVar4 = (long)local_a0._insertpos -
            (long)local_a0._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar4 != 0) {
      memmove(ppuVar7,local_a0._index_block.
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1],sVar4);
    }
  }
  if (uVar6 * 0x80 != (ulong)local_78._left_in_block) {
    if (local_78._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_78._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_001adc2a:
      __assert_fail("not v._index_block.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                    ,0x5b,
                    "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                   );
    }
    ppuVar7 = strings + N_00 + N_02;
    if (8 < uVar6) {
      uVar8 = 2;
      if (2 < (ulong)((long)uVar6 >> 3)) {
        uVar8 = (long)uVar6 >> 3;
      }
      lVar3 = 0;
      do {
        memmove(ppuVar7,local_78._index_block.
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3],0x2000);
        ppuVar7 = ppuVar7 + 0x400;
        lVar3 = lVar3 + 1;
      } while (uVar8 - 1 != lVar3);
    }
    sVar4 = (long)local_78._insertpos -
            (long)local_78._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar4 != 0) {
      memmove(ppuVar7,local_78._index_block.
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1],sVar4);
    }
  }
  vector_block<unsigned_char_*,_1024U>::clear(&local_c8);
  vector_block<unsigned_char_*,_1024U>::clear(&local_a0);
  vector_block<unsigned_char_*,_1024U>::clear(&local_78);
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>(strings,N_00,depth);
  if (bVar2 != 0) {
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>
              (strings + N_00,N_02,depth + 1);
  }
  multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_char>
            (strings + N_00 + N_02,N_01,depth);
  lVar3 = 0x50;
  do {
    vector_block<unsigned_char_*,_1024U>::~vector_block
              ((vector_block<unsigned_char_*,_1024U> *)
               ((long)&local_c8._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x28);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}